

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void duckdb::TemplatedWritePlain<long,long,duckdb::ParquetTimestampSOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  data_ptr_t pdVar1;
  timestamp_t tVar2;
  idx_t r;
  idx_t iVar3;
  NumericStatisticsState<long,_long,_duckdb::BaseParquetOperator> *numeric_stats;
  
  pdVar1 = col->data;
  for (iVar3 = chunk_start; iVar3 < chunk_end; iVar3 = iVar3 + 1) {
    tVar2 = Timestamp::FromEpochSecondsPossiblyInfinite(*(int64_t *)(pdVar1 + iVar3 * 8));
    if (tVar2.value < (long)stats[1]._vptr_ColumnWriterStatistics) {
      stats[1]._vptr_ColumnWriterStatistics = (_func_int **)tVar2.value;
    }
    if ((long)stats[2]._vptr_ColumnWriterStatistics < tVar2.value) {
      stats[2]._vptr_ColumnWriterStatistics = (_func_int **)tVar2.value;
    }
  }
  (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
            (mask,pdVar1 + chunk_start * 8,(chunk_end - chunk_start) * 8);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}